

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kissfft.hh
# Opt level: O3

void __thiscall
kissfft<double>::kf_bfly_generic(kissfft<double> *this,cpx_t *Fout,size_t fstride,size_t m,size_t p)

{
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *this_00;
  undefined8 *puVar1;
  double *pdVar2;
  pointer pcVar3;
  pointer pcVar4;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  cpx_t *pcVar7;
  ulong uVar8;
  long lVar9;
  size_t sVar10;
  size_t sVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  size_t local_a0;
  cpx_t *local_90;
  double local_48;
  double dStack_40;
  
  pcVar3 = (this->_twiddles).
           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  this_00 = &this->_scratchbuf;
  if ((ulong)((long)(this->_scratchbuf).
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->_scratchbuf).
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) < p) {
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize(this_00,p);
  }
  if (m != 0) {
    local_a0 = 0;
    local_90 = Fout;
    do {
      if (p != 0) {
        lVar9 = 0;
        pcVar7 = local_90;
        sVar11 = p;
        do {
          uVar6 = *(undefined8 *)(pcVar7->_M_value + 8);
          puVar1 = (undefined8 *)
                   (((this_00->
                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                     )._M_impl.super__Vector_impl_data._M_start)->_M_value + lVar9);
          *puVar1 = *(undefined8 *)pcVar7->_M_value;
          puVar1[1] = uVar6;
          lVar9 = lVar9 + 0x10;
          pcVar7 = pcVar7 + m;
          sVar11 = sVar11 - 1;
        } while (sVar11 != 0);
        sVar10 = 0;
        sVar11 = local_a0;
        do {
          pcVar4 = (this_00->
                   super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>)
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar6 = *(undefined8 *)(pcVar4->_M_value + 8);
          *(undefined8 *)Fout[sVar11]._M_value = *(undefined8 *)pcVar4->_M_value;
          *(undefined8 *)(Fout[sVar11]._M_value + 8) = uVar6;
          if (1 < p) {
            pcVar7 = Fout + sVar11;
            lVar12 = 0x10;
            lVar14 = 0;
            lVar9 = p - 1;
            do {
              uVar13 = lVar14 + sVar11 * fstride;
              uVar8 = this->_nfft;
              if (uVar13 < uVar8) {
                uVar8 = 0;
              }
              lVar14 = uVar13 - uVar8;
              pdVar2 = (double *)
                       (((this->_scratchbuf).
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_value + lVar12);
              local_48 = *pdVar2;
              dStack_40 = pdVar2[1];
              std::complex<double>::operator*=((complex<double> *)&local_48,pcVar3 + lVar14);
              dStack_40 = *(double *)(pcVar7->_M_value + 8) + dStack_40;
              auVar5._8_4_ = SUB84(dStack_40,0);
              auVar5._0_8_ = *(double *)pcVar7->_M_value + local_48;
              auVar5._12_4_ = (int)((ulong)dStack_40 >> 0x20);
              *(undefined1 (*) [16])pcVar7->_M_value = auVar5;
              lVar12 = lVar12 + 0x10;
              lVar9 = lVar9 + -1;
            } while (lVar9 != 0);
          }
          sVar11 = sVar11 + m;
          sVar10 = sVar10 + 1;
        } while (sVar10 != p);
      }
      local_a0 = local_a0 + 1;
      local_90 = local_90 + 1;
    } while (local_a0 != m);
  }
  return;
}

Assistant:

void kf_bfly_generic(
                cpx_t * const Fout,
                const size_t fstride,
                const std::size_t m,
                const std::size_t p
                ) const
        {
            const cpx_t * twiddles = &_twiddles[0];

            if(p > _scratchbuf.size()) _scratchbuf.resize(p);

            for ( std::size_t u=0; u<m; ++u ) {
                std::size_t k = u;
                for ( std::size_t q1=0 ; q1<p ; ++q1 ) {
                    _scratchbuf[q1] = Fout[ k  ];
                    k += m;
                }

                k=u;
                for ( std::size_t q1=0 ; q1<p ; ++q1 ) {
                    std::size_t twidx=0;
                    Fout[ k ] = _scratchbuf[0];
                    for ( std::size_t q=1;q<p;++q ) {
                        twidx += fstride * k;
                        if (twidx>=_nfft)
                          twidx-=_nfft;
                        Fout[ k ] += _scratchbuf[q] * twiddles[twidx];
                    }
                    k += m;
                }
            }
        }